

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

wchar_t * __thiscall
fmt::v6::
format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
::on_format_specs(format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
                  *this,wchar_t *begin,wchar_t *end)

{
  size_t *psVar1;
  basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler> *pbVar2;
  basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>
  *pbVar3;
  wchar_t *pwVar4;
  wchar_t *pwVar5;
  iterator iVar6;
  basic_format_specs<wchar_t> specs;
  basic_format_specs<wchar_t> local_a0;
  arg_formatter<fmt::v6::buffer_range<wchar_t>_> local_80;
  specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>
  local_58;
  
  pwVar5 = (this->parse_context).format_str_.data_;
  (this->parse_context).format_str_.data_ = begin;
  psVar1 = &(this->parse_context).format_str_.size_;
  *psVar1 = *psVar1 - ((long)begin - (long)pwVar5 >> 2);
  pbVar2 = &this->parse_context;
  pbVar3 = &this->context;
  if ((this->arg).type_ == custom_type) {
    (*(this->arg).value_.field_0.custom.format)
              ((void *)(this->arg).value_.field_0.long_long_value,pbVar2,pbVar3);
    pwVar5 = (this->parse_context).format_str_.data_;
  }
  else {
    local_a0.width = 0;
    local_a0.precision = -1;
    local_a0.type = '\0';
    local_a0._9_1_ = 0;
    local_a0.fill.data_[2] = L'\0';
    local_a0.fill.data_[3] = L'\0';
    local_a0.fill.data_[0] = L' ';
    local_a0.fill.data_[1] = L'\0';
    local_a0.fill.size_ = '\x01';
    local_a0.fill._17_3_ = 0;
    local_58.checker_.arg_type_ = (this->arg).type_;
    local_58.checker_.error_handler_ =
         &local_58.
          super_specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
    ;
    local_58.
    super_specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
    .super_specs_setter<wchar_t>.specs_ = &local_a0;
    local_58.
    super_specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
    .parse_context_ = pbVar2;
    local_58.
    super_specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
    .context_ = pbVar3;
    pwVar5 = internal::
             parse_format_specs<wchar_t,fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>>&>
                       (begin,end,
                        (specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>
                         *)local_58.checker_.error_handler_);
    if ((pwVar5 == end) || (*pwVar5 != L'}')) {
      internal::error_handler::on_error((error_handler *)begin,"missing \'}\' in format string");
    }
    pwVar4 = (this->parse_context).format_str_.data_;
    (this->parse_context).format_str_.data_ = pwVar5;
    psVar1 = &(this->parse_context).format_str_.size_;
    *psVar1 = *psVar1 - ((long)pwVar5 - (long)pwVar4 >> 2);
    local_80.
    super_arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>.
    writer_.out_.container = (this->context).out_.container;
    local_80.
    super_arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>.
    writer_.locale_.locale_ = (this->context).loc_.locale_;
    local_80.
    super_arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>.
    specs_ = &local_a0;
    local_80.ctx_ = pbVar3;
    local_80.parse_ctx_ = pbVar2;
    iVar6 = visit_format_arg<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>
                      (&local_80,&this->arg);
    (this->context).out_.container = iVar6.container;
  }
  return pwVar5;
}

Assistant:

const Char* on_format_specs(const Char* begin, const Char* end) {
    advance_to(parse_context, begin);
    internal::custom_formatter<Context> f(parse_context, context);
    if (visit_format_arg(f, arg)) return parse_context.begin();
    basic_format_specs<Char> specs;
    using internal::specs_handler;
    using parse_context_t = basic_format_parse_context<Char>;
    internal::specs_checker<specs_handler<parse_context_t, Context>> handler(
        specs_handler<parse_context_t, Context>(specs, parse_context, context),
        arg.type());
    begin = parse_format_specs(begin, end, handler);
    if (begin == end || *begin != '}') on_error("missing '}' in format string");
    advance_to(parse_context, begin);
    context.advance_to(
        visit_format_arg(ArgFormatter(context, &parse_context, &specs), arg));
    return begin;
  }